

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetGXNumberOfPassiveStrays(ndicapi *pol)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (pol->GxPassiveStray[0] != '\0') {
    lVar2 = ndiSignedToLong(pol->GxPassiveStray,3);
    iVar1 = (int)lVar2;
    if (-1 < iVar1) {
      iVar3 = 0x14;
      if (iVar1 < 0x14) {
        iVar3 = iVar1;
      }
      return iVar3;
    }
  }
  return 0;
}

Assistant:

ndicapiExport int ndiGetGXNumberOfPassiveStrays(ndicapi* pol)
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0)
  {
    return 0;
  }
  if (n > 20)
  {
    return 20;
  }

  return n;
}